

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.cpp
# Opt level: O2

void __thiscall Refal2::COperationsExecuter::~COperationsExecuter(COperationsExecuter *this)

{
  operator_delete(this->stack);
  CNodeList<Refal2::CUnit>::~CNodeList(&(this->fieldOfView).super_CNodeList<Refal2::CUnit>);
  CExecutionContext::~CExecutionContext(&this->super_CExecutionContext);
  return;
}

Assistant:

COperationsExecuter::~COperationsExecuter()
{
	::operator delete( stack );
}